

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::aux::bt_peer_connection::write_choke(bt_peer_connection *this)

{
  uint uVar1;
  bt_peer_connection *this_local;
  
  uVar1 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xc])();
  if ((uVar1 & 1) == 0) {
    send_message<>(this,msg_choke,num_outgoing_choke);
    extension_notify<void(libtorrent::peer_plugin::*)()>(this,0xf1);
  }
  return;
}

Assistant:

void bt_peer_connection::write_choke()
	{
		INVARIANT_CHECK;

		if (is_choked()) return;
		send_message(msg_choke, counters::num_outgoing_choke);

#ifndef TORRENT_DISABLE_EXTENSIONS
		extension_notify(&peer_plugin::sent_choke);
#endif
	}